

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

char * alloc_string(char *in)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDI;
  size_t i;
  char *out;
  size_t insize;
  size_t local_20;
  
  sVar1 = lodepng_strlen(in_RDI);
  pcVar2 = (char *)lodepng_malloc(0x128d26);
  if (pcVar2 != (char *)0x0) {
    for (local_20 = 0; local_20 != sVar1; local_20 = local_20 + 1) {
      pcVar2[local_20] = in_RDI[local_20];
    }
    pcVar2[local_20] = '\0';
  }
  return pcVar2;
}

Assistant:

static char* alloc_string(const char* in) {
  size_t insize = lodepng_strlen(in);
  char* out = (char*)lodepng_malloc(insize + 1);
  if(out) {
    size_t i;
    for(i = 0; i != insize; ++i) {
      out[i] = in[i];
    }
    out[i] = 0;
  }
  return out;
}